

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_psbt.cpp
# Opt level: O0

DescriptorScriptData *
cfd::ParseDescriptor
          (string *descriptor,
          vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *key_list,
          NetType *net_type)

{
  bool bVar1;
  pointer in_RCX;
  pointer in_RDX;
  value_type *in_RSI;
  DescriptorScriptData *in_RDI;
  KeyData *key;
  iterator __end2;
  iterator __begin2;
  vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *__range2;
  AddressFactory addr_factory_1;
  CfdException *except;
  AddressFactory addr_factory;
  size_t index;
  size_t max;
  NetType target_list [3];
  vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> temp_key_list;
  DescriptorScriptData *script_data;
  vector<cfd::DescriptorKeyData,_std::allocator<cfd::DescriptorKeyData>_> *in_stack_00001cb8;
  vector<cfd::DescriptorScriptData,_std::allocator<cfd::DescriptorScriptData>_> *in_stack_00001cc0;
  string *in_stack_00001cc8;
  string *in_stack_00001cd0;
  AddressFactory *in_stack_00001cd8;
  vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *in_stack_00001cf0;
  undefined8 in_stack_fffffffffffff7f8;
  NetType type;
  DescriptorScriptData *this;
  undefined4 in_stack_fffffffffffff800;
  byte in_stack_fffffffffffff804;
  byte in_stack_fffffffffffff805;
  byte in_stack_fffffffffffff806;
  byte in_stack_fffffffffffff807;
  value_type *in_stack_fffffffffffff808;
  allocator *in_stack_fffffffffffff810;
  __normal_iterator<cfd::core::KeyData_*,_std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>_>
  local_790;
  undefined1 *local_788;
  allocator local_779;
  string local_778 [911];
  allocator local_3e9;
  string local_3e8 [896];
  undefined8 local_68;
  undefined8 local_60;
  undefined8 local_58;
  undefined4 local_50;
  undefined1 local_39;
  pointer local_20;
  pointer local_18;
  value_type *local_10;
  
  type = (NetType)((ulong)in_stack_fffffffffffff7f8 >> 0x20);
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>::vector
            ((vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *)0x3c1471);
  local_39 = 0;
  DescriptorScriptData::DescriptorScriptData(in_RDI);
  if (local_20 == (pointer)0x0) {
    local_58 = 0x100000000;
    local_50 = 2;
    local_60 = 2;
    local_68 = 0;
    AddressFactory::AddressFactory
              ((AddressFactory *)
               CONCAT17(in_stack_fffffffffffff807,
                        CONCAT16(in_stack_fffffffffffff806,
                                 CONCAT15(in_stack_fffffffffffff805,
                                          CONCAT14(in_stack_fffffffffffff804,
                                                   in_stack_fffffffffffff800)))),type);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_3e8,"",&local_3e9);
    this = (DescriptorScriptData *)&stack0xffffffffffffffc8;
    AddressFactory::ParseOutputDescriptor
              (in_stack_00001cd8,in_stack_00001cd0,in_stack_00001cc8,in_stack_00001cc0,
               in_stack_00001cb8,in_stack_00001cf0);
    DescriptorScriptData::operator=
              ((DescriptorScriptData *)
               CONCAT17(in_stack_fffffffffffff807,
                        CONCAT16(in_stack_fffffffffffff806,
                                 CONCAT15(in_stack_fffffffffffff805,
                                          CONCAT14(in_stack_fffffffffffff804,
                                                   in_stack_fffffffffffff800)))),this);
    DescriptorScriptData::~DescriptorScriptData
              ((DescriptorScriptData *)
               CONCAT17(in_stack_fffffffffffff807,
                        CONCAT16(in_stack_fffffffffffff806,
                                 CONCAT15(in_stack_fffffffffffff805,
                                          CONCAT14(in_stack_fffffffffffff804,
                                                   in_stack_fffffffffffff800)))));
    std::__cxx11::string::~string(local_3e8);
    std::allocator<char>::~allocator((allocator<char> *)&local_3e9);
    AddressFactory::~AddressFactory((AddressFactory *)0x3c15b8);
  }
  else {
    AddressFactory::AddressFactory
              ((AddressFactory *)
               CONCAT17(in_stack_fffffffffffff807,
                        CONCAT16(in_stack_fffffffffffff806,
                                 CONCAT15(in_stack_fffffffffffff805,
                                          CONCAT14(in_stack_fffffffffffff804,
                                                   in_stack_fffffffffffff800)))),type);
    in_stack_fffffffffffff810 = &local_779;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_778,"",in_stack_fffffffffffff810);
    this = (DescriptorScriptData *)&stack0xffffffffffffffc8;
    AddressFactory::ParseOutputDescriptor
              (in_stack_00001cd8,in_stack_00001cd0,in_stack_00001cc8,in_stack_00001cc0,
               in_stack_00001cb8,in_stack_00001cf0);
    DescriptorScriptData::operator=
              ((DescriptorScriptData *)
               CONCAT17(in_stack_fffffffffffff807,
                        CONCAT16(in_stack_fffffffffffff806,
                                 CONCAT15(in_stack_fffffffffffff805,
                                          CONCAT14(in_stack_fffffffffffff804,
                                                   in_stack_fffffffffffff800)))),this);
    DescriptorScriptData::~DescriptorScriptData
              ((DescriptorScriptData *)
               CONCAT17(in_stack_fffffffffffff807,
                        CONCAT16(in_stack_fffffffffffff806,
                                 CONCAT15(in_stack_fffffffffffff805,
                                          CONCAT14(in_stack_fffffffffffff804,
                                                   in_stack_fffffffffffff800)))));
    std::__cxx11::string::~string(local_778);
    std::allocator<char>::~allocator((allocator<char> *)&local_779);
    AddressFactory::~AddressFactory((AddressFactory *)0x3c1835);
    in_stack_fffffffffffff808 = local_10;
  }
  if (local_18 != (pointer)0x0) {
    local_788 = &stack0xffffffffffffffc8;
    local_790._M_current =
         (KeyData *)
         std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>::begin
                   ((vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *)this);
    std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>::end
              ((vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *)this);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<cfd::core::KeyData_*,_std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>_>
                               *)CONCAT17(in_stack_fffffffffffff807,
                                          CONCAT16(in_stack_fffffffffffff806,
                                                   CONCAT15(in_stack_fffffffffffff805,
                                                            CONCAT14(in_stack_fffffffffffff804,
                                                                     in_stack_fffffffffffff800)))),
                              (__normal_iterator<cfd::core::KeyData_*,_std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>_>
                               *)this), bVar1) {
      __gnu_cxx::
      __normal_iterator<cfd::core::KeyData_*,_std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>_>
      ::operator*(&local_790);
      in_stack_fffffffffffff807 = cfd::core::KeyData::IsValid();
      in_stack_fffffffffffff804 = 0;
      in_stack_fffffffffffff806 = in_stack_fffffffffffff804;
      if ((in_stack_fffffffffffff807 & 1) != 0) {
        cfd::core::KeyData::GetFingerprint();
        in_stack_fffffffffffff805 = cfd::core::ByteData::IsEmpty();
        in_stack_fffffffffffff804 = in_stack_fffffffffffff805 ^ 0xff;
        in_stack_fffffffffffff806 = in_stack_fffffffffffff804;
        core::ByteData::~ByteData((ByteData *)0x3c198b);
      }
      if ((in_stack_fffffffffffff804 & 1) != 0) {
        std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>::push_back
                  ((vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *)
                   in_stack_fffffffffffff810,in_stack_fffffffffffff808);
      }
      __gnu_cxx::
      __normal_iterator<cfd::core::KeyData_*,_std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>_>
      ::operator++(&local_790);
    }
  }
  local_39 = 1;
  std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>::~vector
            ((vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *)
             in_stack_fffffffffffff810);
  return in_RDI;
}

Assistant:

cfd::DescriptorScriptData ParseDescriptor(
    const std::string& descriptor, std::vector<KeyData>* key_list,
    NetType* net_type = nullptr) {
  std::vector<KeyData> temp_key_list;
  cfd::DescriptorScriptData script_data;
  if (net_type == nullptr) {
    NetType target_list[] = {
        NetType::kMainnet, NetType::kTestnet, NetType::kRegtest};
    size_t max = (sizeof(target_list) / sizeof(NetType)) - 1;
    for (size_t index = 0; index <= max; ++index) {
      try {
        cfd::AddressFactory addr_factory(target_list[index]);
        script_data = addr_factory.ParseOutputDescriptor(
            descriptor, "", nullptr, nullptr, &temp_key_list);
        break;
      } catch (const CfdException& except) {
        if (index == max) {
          throw except;
        }
      }
    }
  } else {
    cfd::AddressFactory addr_factory(*net_type);
    script_data = addr_factory.ParseOutputDescriptor(
        descriptor, "", nullptr, nullptr, &temp_key_list);
  }
  if (key_list != nullptr) {
    for (const auto& key : temp_key_list) {
      if (key.IsValid() && (!key.GetFingerprint().IsEmpty())) {
        key_list->push_back(key);
      }
    }
  }
  return script_data;
}